

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signal-ptr.t.cpp
# Opt level: O3

double * __thiscall dynamicgraph::SignalPtr<double,_int>::accessCopy(SignalPtr<double,_int> *this)

{
  int iVar1;
  double *pdVar2;
  Signal<double,_int> *pSVar3;
  undefined4 extraout_var;
  _func_int **pp_Var4;
  
  pp_Var4 = this->_vptr_SignalPtr;
  if (this->modeNoThrow == true) {
    iVar1 = (*pp_Var4[4])(this);
    pp_Var4 = this->_vptr_SignalPtr;
    if (((char)iVar1 == '\0') && ((&this->field_0x50)[(long)pp_Var4[-3]] == '\x01')) {
      return *(double **)(&this->field_0x48 + (long)pp_Var4[-3]);
    }
  }
  pSVar3 = (Signal<double,_int> *)((long)&this->_vptr_SignalPtr + (long)pp_Var4[-3]);
  if (this->signalPtr == pSVar3) {
    pdVar2 = pSVar3->Tcopy;
  }
  else {
    if (this->transmitAbstract != true) {
      pSVar3 = getPtr(this);
      iVar1 = (*(pSVar3->super_SignalBase<int>)._vptr_SignalBase[0x1d])(pSVar3);
      return (double *)CONCAT44(extraout_var,iVar1);
    }
    pdVar2 = this->transmitAbstractData;
  }
  return pdVar2;
}

Assistant:

const T &SignalPtr<T, Time>::accessCopy() const {
  if (modeNoThrow && (!isPlugged()) && Signal<T, Time>::copyInit)
    return Signal<T, Time>::accessCopy();
  else if (autoref())
    return Signal<T, Time>::accessCopy();
  else if (transmitAbstract)
    return *transmitAbstractData;
  else
    return getPtr()->accessCopy();
}